

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

sexp_conflict
sexp_immutable_string_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict s)

{
  sexp_conflict psVar1;
  
  if ((((ulong)s & 3) == 0) && (s->tag == 9)) {
    psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,9);
    (psVar1->value).flonum = (s->value).flonum;
    (psVar1->value).type.cpl = (s->value).type.cpl;
    (psVar1->value).type.slots = (s->value).type.slots;
    s->field_0x5 = s->field_0x5 | 0x10;
    psVar1->field_0x5 = psVar1->field_0x5 | 1;
    return psVar1;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,9,s);
  return psVar1;
}

Assistant:

sexp sexp_immutable_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp s) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, s);
#if SEXP_USE_PACKED_STRINGS
  /* no sharing with packed strings */
  res = sexp_c_string(ctx, sexp_string_data(s), sexp_string_size(s));
#else
  res = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(res) = sexp_string_bytes(s);
  sexp_string_offset(res) = sexp_string_offset(s);
  sexp_string_size(res) = sexp_string_size(s);
  sexp_copy_on_writep(s) = 1;
#endif
  sexp_immutablep(res) = 1;
  return res;
}